

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry,capnp::Type&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          Type *params)

{
  uint count;
  int iVar1;
  long lVar2;
  HandlerBase *pHVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  Entry *pEVar9;
  Type *in_R8;
  ulong uVar10;
  Maybe<unsigned_long> MVar11;
  
  pEVar9 = table.ptr;
  lVar2._0_2_ = pEVar9[1].key.baseType;
  lVar2._2_1_ = pEVar9[1].key.listDepth;
  lVar2._3_1_ = pEVar9[1].key.isImplicitParam;
  lVar2._4_2_ = pEVar9[1].key.field_3;
  lVar2._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
  if (lVar2 == 0) {
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
    aVar8.value = table.size_;
  }
  else {
    uVar6 = capnp::Type::hashCode(in_R8);
    count._0_2_ = pEVar9[1].key.baseType;
    count._2_1_ = pEVar9[1].key.listDepth;
    count._3_1_ = pEVar9[1].key.isImplicitParam;
    uVar7 = kj::_::chooseBucket((uint)(uVar6 != 0),count);
    aVar8 = extraout_RDX;
    while( true ) {
      uVar10 = (ulong)uVar7;
      pHVar3 = pEVar9->value;
      iVar1 = *(int *)((long)&pHVar3[uVar10]._vptr_HandlerBase + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)&pHVar3[uVar10]._vptr_HandlerBase == (uint)(uVar6 != 0))) &&
         (bVar5 = capnp::Type::operator==((Type *)((ulong)(iVar1 - 2) * 0x18 + table.size_),in_R8),
         aVar8 = extraout_RDX_00, bVar5)) {
        iVar1 = *(int *)((long)&pHVar3[uVar10]._vptr_HandlerBase + 4);
        *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_003dffd7;
      }
      uVar7 = 0;
      lVar4._0_2_ = pEVar9[1].key.baseType;
      lVar4._2_1_ = pEVar9[1].key.listDepth;
      lVar4._3_1_ = pEVar9[1].key.isImplicitParam;
      lVar4._4_2_ = pEVar9[1].key.field_3;
      lVar4._6_2_ = *(undefined2 *)&pEVar9[1].key.field_0x6;
      if (uVar10 + 1 != lVar4) {
        uVar7 = (uint)(uVar10 + 1);
      }
    }
    *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
  }
LAB_003dffd7:
  MVar11.ptr.field_1.value = aVar8.value;
  MVar11.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar11.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }